

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O0

double __thiscall IF97::Region3::mu0(Region3 *this,double T)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  double dVar4;
  double dVar5;
  ulong local_30;
  size_t i;
  double summer;
  double T_bar;
  double T_local;
  Region3 *this_local;
  
  i = 0;
  local_30 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->muJ0);
    if (sVar1 <= local_30) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->mun0,local_30);
    dVar5 = *pvVar2;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->muJ0,local_30);
    dVar4 = powi(T / 647.096,*pvVar3);
    i = (size_t)(dVar5 / dVar4 + (double)i);
    local_30 = local_30 + 1;
  }
  dVar5 = sqrt(T / 647.096);
  return (dVar5 * 100.0) / (double)i;
}

Assistant:

double mu0(double T) const{
            const double T_bar = T/Tcrit;
            double summer = 0.0;
            for (std::size_t i = 0; i < muJ0.size(); ++i)
            {
                summer += mun0[i]/powi(T_bar, muJ0[i]);
            }
            return 100.0*sqrt(T_bar)/summer;
        }